

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::BasicResourceImage::RunIteration
          (BasicResourceImage *this,uvec3 *param_1,uvec3 *num_groups,bool dispatch_indirect)

{
  allocator<tcu::Vector<unsigned_int,_4>_> *this_00;
  allocator<tcu::Vector<float,_4>_> *this_01;
  float fVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  GLuint GVar6;
  uint uVar7;
  uint uVar8;
  int width;
  int height;
  uint num_groups_z;
  int iVar9;
  ulong __n;
  reference pixels;
  uint *data_00;
  reference pixels_00;
  byte *pbVar10;
  reference pvVar11;
  float *pfVar12;
  float fVar13;
  undefined1 local_108 [8];
  vec4 c;
  int x;
  int y;
  vec4 kColorEps;
  undefined8 local_d8;
  int local_d0;
  allocator<unsigned_char> local_c9;
  int i_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> colorData;
  undefined1 local_a8 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> display;
  int i;
  vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> data;
  GLuint kSize;
  GLint kDepth;
  GLint kHeight;
  GLint kWidth;
  string local_50;
  byte local_29;
  uvec3 *puStack_28;
  bool dispatch_indirect_local;
  uvec3 *num_groups_local;
  uvec3 *local_size_local;
  BasicResourceImage *this_local;
  
  local_29 = dispatch_indirect;
  puStack_28 = num_groups;
  num_groups_local = param_1;
  local_size_local = (uvec3 *)this;
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  glcts::(anonymous_namespace)::BasicResourceImage::GenSource_abi_cxx11_
            (&local_50,this,num_groups_local,puStack_28);
  GVar6 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_50);
  this->m_program = GVar6;
  std::__cxx11::string::~string((string *)&local_50);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar5 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar5) {
    uVar7 = tcu::Vector<unsigned_int,_3>::x(num_groups_local);
    uVar8 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
    width = uVar7 * uVar8;
    uVar7 = tcu::Vector<unsigned_int,_3>::y(num_groups_local);
    uVar8 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
    height = uVar7 * uVar8;
    uVar7 = tcu::Vector<unsigned_int,_3>::z(num_groups_local);
    uVar8 = tcu::Vector<unsigned_int,_3>::z(puStack_28);
    data.
    super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = width * height * uVar7 * uVar8;
    __n = (ulong)data.
                 super__Vector_base<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    this_00 = (allocator<tcu::Vector<unsigned_int,_4>_> *)
              ((long)&display.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<unsigned_int,_4>_>::allocator(this_00);
    std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
    vector((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *)
           &i,__n,this_00);
    std::allocator<tcu::Vector<unsigned_int,_4>_>::~allocator
              ((allocator<tcu::Vector<unsigned_int,_4>_> *)
               ((long)&display.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    glu::CallLogWrapper::glGenTextures
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,2,this->m_texture);
    for (display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (int)display.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage < 2;
        display.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)display.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      glu::CallLogWrapper::glBindTexture
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,
                 this->m_texture
                 [(int)display.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage]);
      glu::CallLogWrapper::glTexParameteri
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0x2800,0x2600);
      glu::CallLogWrapper::glTexStorage2D
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,1,0x8236,width,height);
      pixels = std::
               vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
               ::operator[]((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>
                             *)&i,0);
      glu::CallLogWrapper::glTexSubImage2D
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0,0,0,width,height,0x8d94,0x1405,pixels);
    }
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0);
    glu::CallLogWrapper::glBindImageTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,this->m_texture[0],0,'\0',0,0x88ba,0x8236);
    glu::CallLogWrapper::glBindImageTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,this->m_texture[1],0,'\0',0,0x88b9,0x8236);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    if ((local_29 & 1) == 0) {
      uVar7 = tcu::Vector<unsigned_int,_3>::x(puStack_28);
      uVar8 = tcu::Vector<unsigned_int,_3>::y(puStack_28);
      num_groups_z = tcu::Vector<unsigned_int,_3>::z(puStack_28);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,uVar7,uVar8,num_groups_z);
    }
    else {
      if (this->m_dispatch_buffer == 0) {
        glu::CallLogWrapper::glGenBuffers
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,&this->m_dispatch_buffer);
      }
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,this->m_dispatch_buffer);
      data_00 = tcu::Vector<unsigned_int,_3>::operator[](puStack_28,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90ee,0xc,data_00,0x88e4);
      glu::CallLogWrapper::glDispatchComputeIndirect
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
    }
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x20);
    glu::CallLogWrapper::glClear
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x4000);
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c0);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,this->m_texture[0]);
    glu::CallLogWrapper::glActiveTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x84c1);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,this->m_texture[1]);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_draw_program);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_vertex_array);
    glu::CallLogWrapper::glViewport
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,width,height);
    glu::CallLogWrapper::glDrawArraysInstanced
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,5,0,4,1);
    this_01 = (allocator<tcu::Vector<float,_4>_> *)
              ((long)&colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(this_01);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a8,
               (long)(width * height),this_01);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&colorData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<unsigned_char>::allocator(&local_c9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,
               (long)(width * height * 4),&local_c9);
    std::allocator<unsigned_char>::~allocator(&local_c9);
    pixels_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,0);
    glu::CallLogWrapper::glReadPixels
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,0,width,height,0x1908,0x1401,pixels_00);
    glu::CallLogWrapper::glDeleteTextures
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,2,this->m_texture);
    for (local_d0 = 0; local_d0 < width * height * 4; local_d0 = local_d0 + 4) {
      pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,
                           (long)local_d0);
      bVar2 = *pbVar10;
      pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,
                           (long)(local_d0 + 1));
      bVar3 = *pbVar10;
      pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,
                           (long)(local_d0 + 2));
      bVar4 = *pbVar10;
      pbVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,
                           (long)(local_d0 + 3));
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)(kColorEps.m_data + 2),(float)bVar2 / 255.0,
                 (float)bVar3 / 255.0,(float)bVar4 / 255.0,(float)*pbVar10 / 255.0);
      pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_a8,(long)(local_d0 / 4));
      *(undefined8 *)pvVar11->m_data = kColorEps.m_data._8_8_;
      *(undefined8 *)(pvVar11->m_data + 2) = local_d8;
    }
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)&x,&(this->super_ComputeShaderBase).g_color_eps);
    pfVar12 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&x);
    *pfVar12 = *pfVar12 + 0.003921569;
    for (c.m_data[3] = 0.0; (int)c.m_data[3] < height; c.m_data[3] = (float)((int)c.m_data[3] + 1))
    {
      for (c.m_data[2] = 0.0; fVar1 = c.m_data[3], (int)c.m_data[2] < width;
          c.m_data[2] = (float)((int)c.m_data[2] + 1)) {
        iVar9 = ComputeShaderBase::getWindowHeight(&this->super_ComputeShaderBase);
        fVar13 = c.m_data[2];
        if (((int)fVar1 < iVar9) &&
           (iVar9 = ComputeShaderBase::getWindowWidth(&this->super_ComputeShaderBase),
           (int)fVar13 < iVar9)) {
          tcu::Vector<float,_4>::Vector
                    ((Vector<float,_4> *)local_108,
                     (float)((int)c.m_data[3] + (int)c.m_data[2]) / 255.0,1.0,1.0,1.0);
          pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                    operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                *)local_a8,(long)((int)c.m_data[3] * width + (int)c.m_data[2]));
          bVar5 = ComputeShaderBase::ColorEqual
                            (&this->super_ComputeShaderBase,pvVar11,(vec4 *)local_108,(vec4 *)&x);
          if (!bVar5) {
            pvVar11 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                      operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  *)local_a8,(long)((int)c.m_data[3] * width + (int)c.m_data[2]));
            pfVar12 = tcu::Vector<float,_4>::x(pvVar11);
            fVar1 = *pfVar12;
            fVar13 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_108);
            anon_unknown_0::Output
                      ("Got red: %f , expected %f, at (%d, %d)",(double)fVar1,(double)fVar13,
                       (ulong)(uint)c.m_data[2],(ulong)(uint)c.m_data[3]);
            this_local._7_1_ = 0;
            goto LAB_01410a21;
          }
        }
      }
    }
    this_local._7_1_ = 1;
LAB_01410a21:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a8);
    std::vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_>::
    ~vector((vector<tcu::Vector<unsigned_int,_4>,_std::allocator<tcu::Vector<unsigned_int,_4>_>_> *)
            &i);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RunIteration(const uvec3& local_size, const uvec3& num_groups, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size, num_groups));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		const GLint  kWidth  = static_cast<GLint>(local_size.x() * num_groups.x());
		const GLint  kHeight = static_cast<GLint>(local_size.y() * num_groups.y());
		const GLint  kDepth  = static_cast<GLint>(local_size.z() * num_groups.z());
		const GLuint kSize   = kWidth * kHeight * kDepth;

		std::vector<uvec4> data(kSize);
		glGenTextures(2, m_texture);

		for (int i = 0; i < 2; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, m_texture[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, kWidth, kHeight);
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kWidth, kHeight, GL_RED_INTEGER, GL_UNSIGNED_INT, &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(0, m_texture[0], 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
		glBindImageTexture(1, m_texture[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_R32UI);
		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), &num_groups[0], GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups.x(), num_groups.y(), num_groups.z());
		}
		glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

		glClear(GL_COLOR_BUFFER_BIT);
		glActiveTexture(GL_TEXTURE0);
		glBindTexture(GL_TEXTURE_2D, m_texture[0]);
		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, m_texture[1]);
		glUseProgram(m_draw_program);
		glBindVertexArray(m_vertex_array);
		glViewport(0, 0, kWidth, kHeight);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 1);

		std::vector<vec4>	display(kWidth * kHeight);
		std::vector<GLubyte> colorData(kWidth * kHeight * 4);
		glReadPixels(0, 0, kWidth, kHeight, GL_RGBA, GL_UNSIGNED_BYTE, &colorData[0]);
		glDeleteTextures(2, m_texture);

		for (int i = 0; i < kWidth * kHeight * 4; i += 4)
		{
			display[i / 4] =
				vec4(static_cast<GLfloat>(colorData[i] / 255.), static_cast<GLfloat>(colorData[i + 1] / 255.),
					 static_cast<GLfloat>(colorData[i + 2] / 255.), static_cast<GLfloat>(colorData[i + 3] / 255.));
		}

		/* As the colors are converted R8->Rx and then read back as Rx->R8,
		 need to add both conversions to the epsilon. */
		vec4 kColorEps = g_color_eps;
		kColorEps.x() += 1.f / ((1 << 8) - 1.0f);
		for (int y = 0; y < kHeight; ++y)
		{
			for (int x = 0; x < kWidth; ++x)
			{
				if (y >= getWindowHeight() || x >= getWindowWidth())
				{
					continue;
				}
				const vec4 c = vec4(float(y + x) / 255.0f, 1.0f, 1.0f, 1.0f);
				if (!ColorEqual(display[y * kWidth + x], c, kColorEps))
				{
					Output("Got red: %f , expected %f, at (%d, %d)", display[y * kWidth + x].x(), c.x(), x, y);
					return false;
				}
			}
		}

		return true;
	}